

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttsbit.c
# Opt level: O0

FT_Error tt_face_load_strike_metrics(TT_Face face,FT_ULong strike_index,FT_Size_Metrics *metrics)

{
  FT_Byte FVar1;
  ushort uVar2;
  FT_Stream stream_00;
  FT_Byte *pFVar3;
  FT_UShort FVar4;
  uint uVar5;
  ulong uVar6;
  FT_Long FVar7;
  long lVar8;
  FT_Byte *p;
  FT_Error error;
  FT_Pos ppem_;
  TT_HoriHeader *hori;
  FT_UShort resolution;
  FT_UShort ppem;
  FT_UShort upem;
  FT_UInt offset;
  FT_Stream stream;
  FT_Char min_after_bl;
  FT_Char max_before_bl;
  FT_Byte *strike;
  FT_Size_Metrics *metrics_local;
  FT_ULong strike_index_local;
  TT_Face face_local;
  
  if (face->sbit_strike_map == (FT_UInt *)0x0) {
    metrics_local = (FT_Size_Metrics *)strike_index;
    if (face->sbit_num_strikes <= strike_index) {
      return 6;
    }
  }
  else {
    if ((ulong)(long)(face->root).num_fixed_sizes <= strike_index) {
      return 6;
    }
    metrics_local = (FT_Size_Metrics *)(ulong)face->sbit_strike_map[strike_index];
  }
  if (face->sbit_table_type - TT_SBIT_TABLE_TYPE_EBLC < 2) {
    pFVar3 = face->sbit_table;
    lVar8 = (long)metrics_local * 0x30;
    metrics->x_ppem = (ushort)pFVar3[lVar8 + 0x34];
    metrics->y_ppem = (ushort)pFVar3[lVar8 + 0x35];
    metrics->ascender = (long)((int)(char)pFVar3[lVar8 + 0x18] << 6);
    metrics->descender = (long)((int)(char)pFVar3[lVar8 + 0x19] << 6);
    FVar1 = pFVar3[lVar8 + 0x21];
    if (metrics->descender < 1) {
      if ((metrics->descender == 0) && (metrics->ascender == 0)) {
        if ((pFVar3[lVar8 + 0x20] == '\0') && (FVar1 == '\0')) {
          metrics->ascender = (long)(int)((uint)metrics->y_ppem << 6);
          metrics->descender = 0;
        }
        else {
          metrics->ascender = (long)((int)(char)pFVar3[lVar8 + 0x20] << 6);
          metrics->descender = (long)((int)(char)FVar1 << 6);
        }
      }
    }
    else if ((char)FVar1 < '\0') {
      metrics->descender = -metrics->descender;
    }
    metrics->height = metrics->ascender - metrics->descender;
    if (metrics->height == 0) {
      metrics->height = (long)(int)((uint)metrics->y_ppem << 6);
      metrics->descender = metrics->ascender - metrics->height;
    }
    metrics->max_advance =
         (long)(int)(((int)(char)pFVar3[lVar8 + 0x1e] + (uint)pFVar3[lVar8 + 0x1a] +
                     (int)(char)pFVar3[lVar8 + 0x1f]) * 0x40);
    FVar7 = FT_MulDiv((ulong)metrics->x_ppem,0x400000,(ulong)(face->header).Units_Per_EM);
    metrics->x_scale = FVar7;
    FVar7 = FT_MulDiv((ulong)metrics->y_ppem,0x400000,(ulong)(face->header).Units_Per_EM);
    metrics->y_scale = FVar7;
    face_local._4_4_ = 0;
  }
  else if (face->sbit_table_type == TT_SBIT_TABLE_TYPE_SBIX) {
    stream_00 = (face->root).stream;
    pFVar3 = face->sbit_table;
    uVar5 = (uint)pFVar3[(long)metrics_local * 4 + 8] << 0x18 |
            (uint)pFVar3[(long)metrics_local * 4 + 9] << 0x10 |
            (uint)pFVar3[(long)metrics_local * 4 + 10] << 8 |
            (uint)pFVar3[(long)metrics_local * 4 + 0xb];
    if (face->ebdt_size < (ulong)(uVar5 + 4)) {
      face_local._4_4_ = 3;
    }
    else {
      p._4_4_ = FT_Stream_Seek(stream_00,face->ebdt_start + (ulong)uVar5);
      if ((p._4_4_ == 0) && (p._4_4_ = FT_Stream_EnterFrame(stream_00,4), p._4_4_ == 0)) {
        FVar4 = FT_Stream_GetUShort(stream_00);
        FT_Stream_GetUShort(stream_00);
        FT_Stream_ExitFrame(stream_00);
        uVar2 = (face->header).Units_Per_EM;
        metrics->x_ppem = FVar4;
        metrics->y_ppem = FVar4;
        uVar6 = (ulong)FVar4;
        FVar7 = FT_MulDiv((long)(face->horizontal).Ascender,uVar6 << 6,(ulong)uVar2);
        metrics->ascender = FVar7;
        FVar7 = FT_MulDiv((long)(face->horizontal).Descender,uVar6 << 6,(ulong)uVar2);
        metrics->descender = FVar7;
        FVar7 = FT_MulDiv((long)(((int)(face->horizontal).Ascender -
                                 (int)(face->horizontal).Descender) +
                                (int)(face->horizontal).Line_Gap),uVar6 << 6,(ulong)uVar2);
        metrics->height = FVar7;
        FVar7 = FT_MulDiv((ulong)(face->horizontal).advance_Width_Max,uVar6 << 6,(ulong)uVar2);
        metrics->max_advance = FVar7;
        FVar7 = FT_MulDiv((ulong)metrics->x_ppem,0x400000,(ulong)(face->header).Units_Per_EM);
        metrics->x_scale = FVar7;
        FVar7 = FT_MulDiv((ulong)metrics->y_ppem,0x400000,(ulong)(face->header).Units_Per_EM);
        metrics->y_scale = FVar7;
        face_local._4_4_ = p._4_4_;
      }
      else {
        face_local._4_4_ = p._4_4_;
      }
    }
  }
  else {
    face_local._4_4_ = 2;
  }
  return face_local._4_4_;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_face_load_strike_metrics( TT_Face           face,
                               FT_ULong          strike_index,
                               FT_Size_Metrics*  metrics )
  {
    /* we have to test for the existence of `sbit_strike_map'    */
    /* because the function gets also used at the very beginning */
    /* to construct `sbit_strike_map' itself                     */
    if ( face->sbit_strike_map )
    {
      if ( strike_index >= (FT_ULong)face->root.num_fixed_sizes )
        return FT_THROW( Invalid_Argument );

      /* map to real index */
      strike_index = face->sbit_strike_map[strike_index];
    }
    else
    {
      if ( strike_index >= (FT_ULong)face->sbit_num_strikes )
        return FT_THROW( Invalid_Argument );
    }

    switch ( (FT_UInt)face->sbit_table_type )
    {
    case TT_SBIT_TABLE_TYPE_EBLC:
    case TT_SBIT_TABLE_TYPE_CBLC:
      {
        FT_Byte*  strike;
        FT_Char   max_before_bl;
        FT_Char   min_after_bl;


        strike = face->sbit_table + 8 + strike_index * 48;

        metrics->x_ppem = (FT_UShort)strike[44];
        metrics->y_ppem = (FT_UShort)strike[45];

        metrics->ascender  = (FT_Char)strike[16] * 64;  /* hori.ascender  */
        metrics->descender = (FT_Char)strike[17] * 64;  /* hori.descender */

        /* Due to fuzzy wording in the EBLC documentation, we find both */
        /* positive and negative values for `descender'.  Additionally, */
        /* many fonts have both `ascender' and `descender' set to zero  */
        /* (which is definitely wrong).  MS Windows simply ignores all  */
        /* those values...  For these reasons we apply some heuristics  */
        /* to get a reasonable, non-zero value for the height.          */

        max_before_bl = (FT_Char)strike[24];
        min_after_bl  = (FT_Char)strike[25];

        if ( metrics->descender > 0 )
        {
          /* compare sign of descender with `min_after_bl' */
          if ( min_after_bl < 0 )
            metrics->descender = -metrics->descender;
        }

        else if ( metrics->descender == 0 )
        {
          if ( metrics->ascender == 0 )
          {
            FT_TRACE2(( "tt_face_load_strike_metrics:"
                        " sanitizing invalid ascender and descender\n"
                        "                            "
                        " values for strike %d (%dppem, %dppem)\n",
                        strike_index,
                        metrics->x_ppem, metrics->y_ppem ));

            /* sanitize buggy ascender and descender values */
            if ( max_before_bl || min_after_bl )
            {
              metrics->ascender  = max_before_bl * 64;
              metrics->descender = min_after_bl * 64;
            }
            else
            {
              metrics->ascender  = metrics->y_ppem * 64;
              metrics->descender = 0;
            }
          }
        }

#if 0
        else
          ; /* if we have a negative descender, simply use it */
#endif

        metrics->height = metrics->ascender - metrics->descender;
        if ( metrics->height == 0 )
        {
          FT_TRACE2(( "tt_face_load_strike_metrics:"
                      " sanitizing invalid height value\n"
                      "                            "
                      " for strike (%d, %d)\n",
                      metrics->x_ppem, metrics->y_ppem ));
          metrics->height    = metrics->y_ppem * 64;
          metrics->descender = metrics->ascender - metrics->height;
        }

        /* Is this correct? */
        metrics->max_advance = ( (FT_Char)strike[22] + /* min_origin_SB  */
                                          strike[18] + /* max_width      */
                                 (FT_Char)strike[23]   /* min_advance_SB */
                                                     ) * 64;

        /* set the scale values (in 16.16 units) so advances */
        /* from the hmtx and vmtx table are scaled correctly */
        metrics->x_scale = FT_MulDiv( metrics->x_ppem,
                                      64 * 0x10000,
                                      face->header.Units_Per_EM );
        metrics->y_scale = FT_MulDiv( metrics->y_ppem,
                                      64 * 0x10000,
                                      face->header.Units_Per_EM );

        return FT_Err_Ok;
      }

    case TT_SBIT_TABLE_TYPE_SBIX:
      {
        FT_Stream       stream = face->root.stream;
        FT_UInt         offset;
        FT_UShort       upem, ppem, resolution;
        TT_HoriHeader  *hori;
        FT_Pos          ppem_; /* to reduce casts */

        FT_Error  error;
        FT_Byte*  p;


        p      = face->sbit_table + 8 + 4 * strike_index;
        offset = FT_NEXT_ULONG( p );

        if ( offset + 4 > face->ebdt_size )
          return FT_THROW( Invalid_File_Format );

        if ( FT_STREAM_SEEK( face->ebdt_start + offset ) ||
             FT_FRAME_ENTER( 4 )                         )
          return error;

        ppem       = FT_GET_USHORT();
        resolution = FT_GET_USHORT();

        FT_UNUSED( resolution ); /* What to do with this? */

        FT_FRAME_EXIT();

        upem = face->header.Units_Per_EM;
        hori = &face->horizontal;

        metrics->x_ppem = ppem;
        metrics->y_ppem = ppem;

        ppem_ = (FT_Pos)ppem;

        metrics->ascender =
          FT_MulDiv( hori->Ascender, ppem_ * 64, upem );
        metrics->descender =
          FT_MulDiv( hori->Descender, ppem_ * 64, upem );
        metrics->height =
          FT_MulDiv( hori->Ascender - hori->Descender + hori->Line_Gap,
                     ppem_ * 64, upem );
        metrics->max_advance =
          FT_MulDiv( hori->advance_Width_Max, ppem_ * 64, upem );

        /* set the scale values (in 16.16 units) so advances */
        /* from the hmtx and vmtx table are scaled correctly */
        metrics->x_scale = FT_MulDiv( metrics->x_ppem,
                                      64 * 0x10000,
                                      face->header.Units_Per_EM );
        metrics->y_scale = FT_MulDiv( metrics->y_ppem,
                                      64 * 0x10000,
                                      face->header.Units_Per_EM );

        return error;
      }

    default:
      return FT_THROW( Unknown_File_Format );
    }
  }